

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor-inl.h
# Opt level: O2

void __thiscall spdlog::details::executor::~executor(executor *this)

{
  context *pcVar1;
  
  pcVar1 = this->ctx_;
  if (pcVar1 != (context *)0x0) {
    (pcVar1->msg).super_log_msg.params = &(pcVar1->msg).params_buffer;
    logger::executor_callback
              (pcVar1->lgr,&(pcVar1->msg).super_log_msg,pcVar1->log_enabled,
               pcVar1->traceback_enabled);
    log_msg_buffer::~log_msg_buffer(&this->ctx_->msg);
    return;
  }
  return;
}

Assistant:

SPDLOG_INLINE executor::~executor() noexcept(false)
{
    if (ctx_)
    {
        ctx_->msg.params = &ctx_->msg.params_buffer;
        try
        {
            ctx_->lgr->executor_callback(ctx_->msg, ctx_->log_enabled, ctx_->traceback_enabled);
        }
        catch (...)
        {
            ctx_->~context();
            throw;
        }
        ctx_->~context();
    }
}